

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

bool __thiscall QThreadPoolPrivate::waitForDone(QThreadPoolPrivate *this,QDeadlineTimer *timer)

{
  bool bVar1;
  byte bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool local_29;
  QThreadPoolPrivate *this_00;
  
  this_00 = *(QThreadPoolPrivate **)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = QList<QueuePage_*>::isEmpty((QList<QueuePage_*> *)0x6cb351);
    if ((!bVar1) || (bVar2 = 0, *(int *)(in_RDI + 0xfc) != 0)) {
      bVar1 = QDeadlineTimer::hasExpired
                        ((QDeadlineTimer *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      bVar2 = bVar1 ^ 0xff;
    }
    if ((bVar2 & 1) == 0) break;
    QWaitCondition::wait((QWaitCondition *)(in_RDI + 0xd0),(void *)(in_RDI + 0x78));
  }
  bVar1 = QList<QueuePage_*>::isEmpty((QList<QueuePage_*> *)0x6cb3e7);
  if ((bVar1) && (*(int *)(in_RDI + 0xfc) == 0)) {
    reset(this_00);
    local_29 = true;
  }
  else {
    local_29 = false;
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)
             CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  if (*(QThreadPoolPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QThreadPoolPrivate::waitForDone(const QDeadlineTimer &timer)
{
    QMutexLocker locker(&mutex);
    while (!(queue.isEmpty() && activeThreads == 0) && !timer.hasExpired())
        noActiveThreads.wait(&mutex, timer);

    if (!queue.isEmpty() || activeThreads)
        return false;

    reset();
    // New jobs might have started during reset, but return anyway
    // as the active thread and task count did reach 0 once, and
    // race conditions are outside our scope.
    return true;
}